

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.c
# Opt level: O1

IceTImage getRenderBuffer(void)

{
  IceTTimeStamp IVar1;
  IceTTimeStamp IVar2;
  IceTImage image;
  IceTVoid *buffer;
  IceTSizeType dummy_size;
  IceTVoid *buffer_1;
  undefined8 local_28;
  IceTSizeType local_1c;
  IceTVoid *local_18;
  
  IVar1 = icetStateGetTime(0x93);
  IVar2 = icetStateGetTime(0x80);
  if (IVar2 < IVar1) {
    icetGetPointerv(0x93,(IceTVoid **)&local_28);
    image = icetImageUnpackageFromReceive
                      ((IceTVoid *)CONCAT44(local_28._4_4_,(IceTSizeType)local_28));
  }
  else {
    icetGetIntegerv(7,(IceTInt *)&local_28);
    icetGetIntegerv(8,(IceTInt *)((long)&local_28 + 4));
    image = icetGetStateBufferImage(0x91,(IceTSizeType)local_28,local_28._4_4_);
    icetStateSetIntegerv(0x92,2,(IceTInt *)&local_28);
    icetImagePackageForSend(image,&local_18,&local_1c);
    icetStateSetPointer(0x93,local_18);
  }
  return (IceTImage)image.opaque_internals;
}

Assistant:

static IceTImage getRenderBuffer(void)
{
    /* Check to see if we are in the same frame as the last time we returned
       this buffer.  In that case, just restore the buffer because it still has
       the image we need. */
    if (  icetStateGetTime(ICET_RENDER_BUFFER_HOLD)
        > icetStateGetTime(ICET_IS_DRAWING_FRAME) ) {
      /* A little bit of hackery: this assumes that a buffer initialized is the
         same one returned from icetImagePackageForSend.  It (currently)
         does. */
        IceTVoid *buffer;
        icetRaiseDebug("Last render should still be good.");
        icetGetPointerv(ICET_RENDER_BUFFER_HOLD, &buffer);
        return icetImageUnpackageFromReceive(buffer);       
    } else {
        IceTInt dim[2];
        IceTImage image;
        IceTVoid *buffer;
        IceTSizeType dummy_size;

        icetGetIntegerv(ICET_PHYSICAL_RENDER_WIDTH, &dim[0]);
        icetGetIntegerv(ICET_PHYSICAL_RENDER_HEIGHT, &dim[1]);

        /* Create a new image object. */
        image = icetGetStateBufferImage(ICET_RENDER_BUFFER, dim[0], dim[1]);

        /* Record image size and pointer to memory.  It is important to "touch"
           ICET_RENDER_BUFFER_HOLD to signify the time we created the image so
           that the above check works on the next call. */

        icetStateSetIntegerv(ICET_RENDER_BUFFER_SIZE, 2, dim);

        icetImagePackageForSend(image, &buffer, &dummy_size);
        icetStateSetPointer(ICET_RENDER_BUFFER_HOLD, buffer);

        return image;
    }
}